

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleFile.cpp
# Opt level: O0

int __thiscall ModuleFile::open(ModuleFile *this,char *__file,int __oflag,...)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  FormatError FVar3;
  Module *this_00;
  undefined8 uVar4;
  string local_250;
  istream local_230 [8];
  ifstream in;
  Module *mod_local;
  QString *path_local;
  ModuleFile *this_local;
  
  QString::toStdString_abi_cxx11_(&local_250,(QString *)__file);
  _Var2 = std::operator|(_S_bin,_S_in);
  std::ifstream::ifstream(local_230,(string *)&local_250,_Var2);
  std::__cxx11::string::~string((string *)&local_250);
  bVar1 = std::ios::fail();
  this->mIoError = (bool)(bVar1 & 1);
  if ((this->mIoError & 1U) == 0) {
    this_00 = Module::data(___oflag);
    FVar3 = trackerboy::Module::deserialize(this_00,local_230);
    this->mLastError = FVar3;
    bVar1 = std::ios::fail();
    this->mIoError = (bool)(bVar1 & 1);
    if (this->mLastError == none) {
      updateFilename(this,(QString *)__file);
      Module::reset(___oflag);
      this_local._7_1_ = 1;
      goto LAB_0017ae91;
    }
    Module::clear(___oflag);
  }
  this_local._7_1_ = 0;
LAB_0017ae91:
  uVar4 = std::ifstream::~ifstream(local_230);
  return (int)CONCAT71((int7)((ulong)uVar4 >> 8),this_local._7_1_);
}

Assistant:

bool ModuleFile::open(QString const& path, Module &mod) {
    
    std::ifstream in(path.toStdString(), std::ios::binary | std::ios::in);
    mIoError = in.fail();

    if (!mIoError) {

        mLastError = mod.data().deserialize(in);
        mIoError = in.fail();
        if (mLastError == trackerboy::FormatError::none) {
            updateFilename(path);
            // emits the reset signal
            mod.reset();
            return true;
        } else {
            // failed to deserialize module but the module might be paritially loaded
            // clear it
            mod.clear();
        }
    }

    return false;
}